

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_connection::incoming_request(peer_connection *this,peer_request *r)

{
  byte bVar1;
  ushort uVar2;
  time_point reference;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  bool bVar5;
  unsigned_short uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  element_type *peVar11;
  strong_typedef *psVar12;
  __shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar13;
  size_type sVar14;
  difference_type dVar15;
  alert_manager *paVar16;
  torrent_info *ptVar17;
  value_type *pvVar18;
  time_point new_value;
  undefined8 in_stack_fffffffffffffb38;
  undefined4 uVar20;
  undefined8 uVar19;
  bool *args_5;
  undefined8 in_stack_fffffffffffffb40;
  undefined4 uVar21;
  bool *args_6;
  bool local_452;
  bool local_419;
  bool local_3f1;
  uint local_3a0;
  uint local_2f8;
  uint local_278;
  uint local_260;
  bool local_21a;
  undefined1 local_1f0 [56];
  duration local_1b8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1b0;
  int local_1a4;
  duration<long,_std::ratio<1L,_1L>_> local_1a0;
  unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_> local_198
  ;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_190;
  undefined1 local_181;
  error_code local_180;
  error_code local_170;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_160;
  undefined1 local_159;
  int blocks_per_piece;
  error_code local_148;
  bool local_131;
  int local_130;
  bool local_129;
  undefined1 local_128 [19];
  bool local_115;
  int local_114;
  piece_index_t pStack_110;
  bool peer_interested_1;
  int local_10c;
  storage_index_t local_108;
  int local_104;
  int local_100;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_fc;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_f8;
  bool local_f2;
  bool local_f1;
  int local_f0;
  bool local_e9;
  undefined1 local_e8 [64];
  __normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  fast_iter;
  int fast_idx;
  shared_ptr<libtorrent::peer_plugin> *e;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
  *__range2;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_78;
  bool local_71;
  undefined1 local_70 [19];
  bool local_5d;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_5c;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> sStack_58;
  bool peer_interested;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_54;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_50;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_4c;
  bool local_45;
  bool valid_piece_index;
  unique_ptr<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_> local_38;
  torrent_info *ti;
  shared_ptr<libtorrent::aux::torrent> t;
  peer_request *r_local;
  peer_connection *this_local;
  
  uVar20 = (undefined4)((ulong)in_stack_fffffffffffffb38 >> 0x20);
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)r;
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)&ti);
  peVar11 = ::std::
            __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&ti);
  local_38._M_t.
  super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>.
  _M_t.
  super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
  .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl =
       (__uniq_ptr_data<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>,_true,_true>
        )torrent::torrent_file(peVar11);
  counters::inc_stats_counter(this->m_counters,0xf,1);
  _Var3 = t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_4c,0);
  bVar4 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                    ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)_Var3._M_pi,
                     &local_4c);
  _Var3 = t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_21a = false;
  if (bVar4) {
    peVar11 = ::std::
              __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ti);
    ptVar17 = torrent::torrent_file(peVar11);
    local_50.m_val = (uint)torrent_info::end_piece(ptVar17);
    local_21a = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                          ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                           _Var3._M_pi,
                           (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&local_50)
    ;
  }
  local_45 = local_21a;
  uVar7 = strong_typedef::operator_cast_to_int
                    ((strong_typedef *)
                     t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  uVar19 = CONCAT44(uVar20,(t.
                            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count);
  peer_log(this,incoming_message,"REQUEST","piece: %d s: %x l: %x",(ulong)uVar7,
           (ulong)*(uint *)((long)&(t.
                                    super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 4),uVar19);
  peVar11 = ::std::
            __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&ti);
  bVar4 = torrent::super_seeding(peVar11);
  if (bVar4) {
    local_54.m_val =
         *(uint *)&(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_vptr__Sp_counted_base;
    bVar4 = super_seeded_piece(this,(piece_index_t)local_54.m_val);
    uVar20 = (undefined4)((ulong)uVar19 >> 0x20);
    uVar21 = (undefined4)((ulong)in_stack_fffffffffffffb40 >> 0x20);
    if (!bVar4) {
      counters::inc_stats_counter(this->m_counters,0x11,1);
      uVar2 = this->m_num_invalid_requests;
      uVar6 = ::std::numeric_limits<unsigned_short>::max();
      if (uVar2 < uVar6) {
        this->m_num_invalid_requests = this->m_num_invalid_requests + 1;
      }
      bVar4 = should_log(this,info);
      if (bVar4) {
        bVar1 = this->field_0x887;
        if ((local_45 & 1U) == 0) {
          local_260 = 0xffffffff;
        }
        else {
          peVar11 = ::std::
                    __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&ti);
          ptVar17 = torrent::torrent_file(peVar11);
          sStack_58.m_val =
               *(uint *)&(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_vptr__Sp_counted_base;
          local_260 = torrent_info::piece_size(ptVar17,sStack_58.m_val);
        }
        peVar11 = ::std::
                  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&ti);
        ptVar17 = torrent::torrent_file(peVar11);
        iVar8 = torrent_info::num_pieces(ptVar17);
        if ((local_45 & 1U) == 0) {
          local_278 = 0;
        }
        else {
          peVar11 = ::std::
                    __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&ti);
          local_5c.m_val =
               *(uint *)&(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_vptr__Sp_counted_base;
          bVar4 = torrent::has_piece_passed(peVar11,(piece_index_t)local_5c.m_val);
          local_278 = (uint)bVar4;
        }
        psVar12 = (strong_typedef *)
                  ::std::
                  array<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_2UL>
                  ::operator[](&this->m_superseed_piece,0);
        iVar9 = strong_typedef::operator_cast_to_int(psVar12);
        psVar12 = (strong_typedef *)
                  ::std::
                  array<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_2UL>
                  ::operator[](&this->m_superseed_piece,1);
        iVar10 = strong_typedef::operator_cast_to_int(psVar12);
        peer_log(this,info,"INVALID_REQUEST",
                 "piece not super-seeded i: %d t: %d n: %d h: %d ss1: %d ss2: %d",
                 (ulong)(bVar1 >> 1 & 1),(ulong)local_260,CONCAT44(uVar20,iVar8),
                 CONCAT44(uVar21,local_278),iVar9,iVar10);
      }
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2b])
                (this,t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
      peVar11 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ti);
      paVar16 = torrent::alerts(peVar11);
      bVar4 = alert_manager::should_post<libtorrent::invalid_request_alert>(paVar16);
      if (bVar4) {
        local_5d = (bool)((byte)this->field_0x887 >> 1 & 1);
        peVar11 = ::std::
                  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&ti);
        paVar16 = torrent::alerts(peVar11);
        ::std::
        __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&ti);
        torrent::get_handle((torrent *)local_70);
        _Var3 = t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
        peVar11 = ::std::
                  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&ti);
        local_78.m_val =
             *(uint *)&(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_vptr__Sp_counted_base;
        local_71 = torrent::has_piece_passed(peVar11,(piece_index_t)local_78.m_val);
        __range2._7_1_ = 1;
        alert_manager::
        emplace_alert<libtorrent::invalid_request_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::digest32<160l>&,libtorrent::peer_request_const&,bool,bool_const&,bool>
                  (paVar16,(torrent_handle *)local_70,&this->m_remote,&this->m_peer_id,
                   (peer_request *)_Var3._M_pi,&local_71,&local_5d,(bool *)((long)&__range2 + 7));
        torrent_handle::~torrent_handle((torrent_handle *)local_70);
      }
      __range2._0_4_ = 1;
      goto LAB_00447751;
    }
  }
  if ((*(ushort *)&this->field_0x885 >> 0xb & 1) == 0) {
    incoming_have_none(this);
  }
  uVar7 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
  if ((uVar7 & 1) != 0) {
    __range2._0_4_ = 1;
    goto LAB_00447751;
  }
  __end2 = ::std::__cxx11::
           list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
           ::begin(&this->m_extensions);
  e = (shared_ptr<libtorrent::peer_plugin> *)
      ::std::__cxx11::
      list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
      ::end(&this->m_extensions);
  while( true ) {
    bVar4 = ::std::operator!=(&__end2,(_Self *)&e);
    uVar21 = (undefined4)((ulong)in_stack_fffffffffffffb40 >> 0x20);
    uVar20 = (undefined4)((ulong)uVar19 >> 0x20);
    if (!bVar4) break;
    this_00 = (__shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)::std::_List_iterator<std::shared_ptr<libtorrent::peer_plugin>_>::operator*
                           (&__end2);
    peVar13 = ::std::
              __shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_00);
    uVar7 = (*peVar13->_vptr_peer_plugin[0x12])
                      (peVar13,t.
                               super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
    if ((uVar7 & 1) != 0) {
      __range2._0_4_ = 1;
      goto LAB_00447751;
    }
    ::std::_List_iterator<std::shared_ptr<libtorrent::peer_plugin>_>::operator++(&__end2);
  }
  uVar7 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
  if ((uVar7 & 1) != 0) {
    __range2._0_4_ = 1;
    goto LAB_00447751;
  }
  peVar11 = ::std::
            __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&ti);
  bVar4 = torrent::valid_metadata(peVar11);
  if (!bVar4) {
    counters::inc_stats_counter(this->m_counters,0x11,1);
    peer_log(this,info,"INVALID_REQUEST","we don\'t have metadata yet");
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2b])
              (this,t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
    __range2._0_4_ = 1;
    goto LAB_00447751;
  }
  sVar14 = ::std::vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>::size
                     (&(this->m_requests).
                       super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                     );
  iVar8 = session_settings::get_int((this->super_peer_connection_hot_members).m_settings,0x4007);
  if (iVar8 < (int)sVar14) {
    counters::inc_stats_counter(this->m_counters,0x10,1);
    sVar14 = ::std::vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>::
             size(&(this->m_requests).
                   super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                 );
    peer_log(this,info,"INVALID_REQUEST","incoming request queue full %d",sVar14 & 0xffffffff);
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2b])
              (this,t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
    __range2._0_4_ = 1;
    goto LAB_00447751;
  }
  fast_iter._M_current._4_4_ = -1;
  local_e8._48_8_ =
       ::std::
       vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
       ::begin(&this->m_accept_fast);
  local_e8._40_8_ =
       ::std::
       vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
       ::end(&this->m_accept_fast);
  local_e8._56_8_ =
       ::std::
       find<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>
                 ((__normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                   )local_e8._48_8_,
                  (__normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                   )local_e8._40_8_,
                  (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi);
  local_e8._32_8_ =
       ::std::
       vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
       ::end(&this->m_accept_fast);
  bVar4 = __gnu_cxx::operator!=
                    ((__normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                      *)(local_e8 + 0x38),
                     (__normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                      *)(local_e8 + 0x20));
  if (bVar4) {
    local_e8._24_8_ =
         ::std::
         vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
         ::begin(&this->m_accept_fast);
    dVar15 = __gnu_cxx::operator-
                       ((__normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                         *)(local_e8 + 0x38),
                        (__normal_iterator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                         *)(local_e8 + 0x18));
    fast_iter._M_current._4_4_ = (int)dVar15;
  }
  if (((byte)this->field_0x887 >> 1 & 1) == 0) {
    bVar4 = should_log(this,info);
    if (bVar4) {
      if ((local_45 & 1U) == 0) {
        local_2f8 = 0xffffffff;
      }
      else {
        peVar11 = ::std::
                  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&ti);
        ptVar17 = torrent::torrent_file(peVar11);
        local_e8._20_4_ =
             *(undefined4 *)
              &(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_vptr__Sp_counted_base;
        local_2f8 = torrent_info::piece_size(ptVar17,(piece_index_t)local_e8._20_4_);
      }
      peVar11 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ti);
      ptVar17 = torrent::torrent_file(peVar11);
      uVar7 = torrent_info::num_pieces(ptVar17);
      peVar11 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ti);
      iVar8 = torrent::block_size(peVar11);
      uVar19 = CONCAT44(uVar20,iVar8);
      peer_log(this,info,"INVALID_REQUEST","peer is not interested  t: %d n: %d block_limit: %d",
               (ulong)local_2f8,(ulong)uVar7,uVar19);
      uVar20 = (undefined4)((ulong)uVar19 >> 0x20);
      peer_log(this,info,"INTERESTED","artificial incoming INTERESTED message");
    }
    peVar11 = ::std::
              __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ti);
    paVar16 = torrent::alerts(peVar11);
    bVar4 = alert_manager::should_post<libtorrent::invalid_request_alert>(paVar16);
    if (bVar4) {
      peVar11 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ti);
      paVar16 = torrent::alerts(peVar11);
      ::std::__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&ti);
      torrent::get_handle((torrent *)local_e8);
      _Var3 = t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ;
      peVar11 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ti);
      local_f0 = *(int *)&(t.
                           super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base;
      local_e9 = torrent::has_piece_passed(peVar11,(piece_index_t)local_f0);
      local_f1 = false;
      local_f2 = false;
      args_6 = &local_f2;
      args_5 = &local_f1;
      alert_manager::
      emplace_alert<libtorrent::invalid_request_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::digest32<160l>&,libtorrent::peer_request_const&,bool,bool,bool>
                (paVar16,(torrent_handle *)local_e8,&this->m_remote,&this->m_peer_id,
                 (peer_request *)_Var3._M_pi,&local_e9,args_5,args_6);
      uVar21 = (undefined4)((ulong)args_6 >> 0x20);
      uVar20 = (undefined4)((ulong)args_5 >> 0x20);
      torrent_handle::~torrent_handle((torrent_handle *)local_e8);
    }
    incoming_interested(this);
  }
  _Var3._M_pi = t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_f8,0);
  bVar5 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                    ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)_Var3._M_pi,
                     &local_f8);
  _Var3 = t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  bVar4 = true;
  if (!bVar5) {
    peVar11 = ::std::
              __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ti);
    ptVar17 = torrent::torrent_file(peVar11);
    local_fc.m_val = (int)torrent_info::end_piece(ptVar17);
    bVar5 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator>=
                      ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)_Var3._M_pi,
                       &local_fc);
    bVar4 = true;
    if (!bVar5) {
      peVar11 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ti);
      local_100 = *(int *)&(t.
                            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_vptr__Sp_counted_base;
      bVar4 = torrent::has_piece_passed(peVar11,(piece_index_t)local_100);
      if (!bVar4) {
        peVar11 = ::std::
                  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&ti);
        local_104 = *(int *)&(t.
                              super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_vptr__Sp_counted_base;
        bVar4 = torrent::is_predictive_piece(peVar11,(piece_index_t)local_104);
        if (!bVar4) {
          peVar11 = ::std::
                    __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&ti);
          bVar5 = torrent::seed_mode(peVar11);
          bVar4 = true;
          if (!bVar5) goto LAB_00446d0e;
        }
      }
      bVar4 = true;
      if (-1 < *(int *)((long)&(t.
                                super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi)->_vptr__Sp_counted_base + 4)) {
        iVar8 = *(int *)((long)&(t.
                                 super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi)->_vptr__Sp_counted_base + 4);
        local_108.m_val =
             *(uint *)&(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_vptr__Sp_counted_base;
        iVar9 = torrent_info::piece_size
                          ((torrent_info *)
                           local_38._M_t.
                           super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
                           .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl,
                           (piece_index_t)local_108.m_val);
        bVar4 = true;
        if ((iVar8 < iVar9) &&
           (bVar4 = true,
           0 < (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count)) {
          iVar8 = *(int *)((long)&(t.
                                   super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_vptr__Sp_counted_base + 4);
          iVar9 = (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count;
          local_10c = *(int *)&(t.
                                super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi)->_vptr__Sp_counted_base;
          iVar10 = torrent_info::piece_size
                             ((torrent_info *)
                              local_38._M_t.
                              super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
                              .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>.
                              _M_head_impl,(piece_index_t)local_10c);
          bVar4 = true;
          if (iVar9 + iVar8 <= iVar10) {
            iVar8 = (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count;
            peVar11 = ::std::
                      __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&ti);
            iVar9 = torrent::block_size(peVar11);
            bVar4 = iVar9 < iVar8;
          }
        }
      }
    }
  }
LAB_00446d0e:
  if (bVar4) {
    counters::inc_stats_counter(this->m_counters,0x11,1);
    bVar4 = should_log(this,info);
    if (bVar4) {
      bVar1 = this->field_0x887;
      if ((local_45 & 1U) == 0) {
        local_3a0 = 0xffffffff;
      }
      else {
        peVar11 = ::std::
                  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&ti);
        ptVar17 = torrent::torrent_file(peVar11);
        pStack_110.m_val =
             *(int *)&(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_vptr__Sp_counted_base;
        local_3a0 = torrent_info::piece_size(ptVar17,pStack_110);
      }
      iVar8 = torrent_info::num_pieces
                        ((torrent_info *)
                         local_38._M_t.
                         super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
                         .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl);
      peVar11 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ti);
      local_114 = *(int *)&(t.
                            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_vptr__Sp_counted_base;
      bVar4 = torrent::has_piece_passed(peVar11,(piece_index_t)local_114);
      peVar11 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ti);
      iVar9 = torrent::block_size(peVar11);
      peer_log(this,info,"INVALID_REQUEST","i: %d t: %d n: %d h: %d block_limit: %d",
               (ulong)(bVar1 >> 1 & 1),(ulong)local_3a0,CONCAT44(uVar20,iVar8),
               CONCAT44(uVar21,(uint)bVar4),iVar9);
    }
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2b])
              (this,t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
    uVar2 = this->m_num_invalid_requests;
    uVar6 = ::std::numeric_limits<unsigned_short>::max();
    if (uVar2 < uVar6) {
      this->m_num_invalid_requests = this->m_num_invalid_requests + 1;
    }
    peVar11 = ::std::
              __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ti);
    paVar16 = torrent::alerts(peVar11);
    bVar4 = alert_manager::should_post<libtorrent::invalid_request_alert>(paVar16);
    if (bVar4) {
      local_115 = (bool)((byte)this->field_0x887 >> 1 & 1);
      peVar11 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ti);
      paVar16 = torrent::alerts(peVar11);
      ::std::__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&ti);
      torrent::get_handle((torrent *)local_128);
      _Var3 = t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ;
      peVar11 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ti);
      local_130 = *(int *)&(t.
                            super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_vptr__Sp_counted_base;
      local_129 = torrent::has_piece_passed(peVar11,(piece_index_t)local_130);
      local_131 = false;
      alert_manager::
      emplace_alert<libtorrent::invalid_request_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::digest32<160l>&,libtorrent::peer_request_const&,bool,bool_const&,bool>
                (paVar16,(torrent_handle *)local_128,&this->m_remote,&this->m_peer_id,
                 (peer_request *)_Var3._M_pi,&local_129,&local_115,&local_131);
      torrent_handle::~torrent_handle((torrent_handle *)local_128);
    }
    if (((((byte)this->field_0x887 >> 1 & 1) == 0) && ((uint)this->m_num_invalid_requests % 10 == 0)
        ) && (((byte)(this->super_peer_connection_hot_members).field_0x28 >> 5 & 1) != 0)) {
      local_3f1 = false;
      if ((300 < this->m_num_invalid_requests) &&
         (local_3f1 = false, -1 < *(short *)&this->field_0x885)) {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  (&local_148,too_many_requests_when_choked,(type *)0x0);
        local_3f1 = can_disconnect(this,&local_148);
      }
      if (local_3f1 != false) {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  ((error_code *)&blocks_per_piece,too_many_requests_when_choked,(type *)0x0);
        local_159 = 2;
        (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                  (this,(error_code *)&blocks_per_piece,1,2);
        __range2._0_4_ = 1;
        goto LAB_00447751;
      }
      peer_log(this,outgoing_message,"CHOKE");
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1f])();
    }
    __range2._0_4_ = 1;
  }
  else {
    iVar8 = torrent_info::piece_length
                      ((torrent_info *)
                       local_38._M_t.
                       super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
                       .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl);
    peVar11 = ::std::
              __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ti);
    iVar9 = torrent::block_size(peVar11);
    peVar11 = ::std::
              __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&ti);
    iVar10 = torrent::block_size(peVar11);
    local_160.m_val = (iVar8 + -1 + iVar9) / iVar10;
    local_419 = false;
    if ((((byte)(this->super_peer_connection_hot_members).field_0x28 >> 5 & 1) != 0) &&
       (local_419 = false, fast_iter._M_current._4_4_ != -1)) {
      pvVar18 = container_wrapper<unsigned_short,_int,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                ::operator[](&this->m_accept_fast_piece_cnt,fast_iter._M_current._4_4_);
      local_419 = false;
      if ((int)(local_160.m_val * 3) <= (int)(uint)*pvVar18) {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  (&local_170,too_many_requests_when_choked,(type *)0x0);
        local_419 = can_disconnect(this,&local_170);
      }
    }
    if (local_419 == false) {
      if ((((byte)(this->super_peer_connection_hot_members).field_0x28 >> 5 & 1) == 0) ||
         (fast_iter._M_current._4_4_ != -1)) {
        if (fast_iter._M_current._4_4_ != -1) {
          pvVar18 = container_wrapper<unsigned_short,_int,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                    ::operator[](&this->m_accept_fast_piece_cnt,fast_iter._M_current._4_4_);
          *pvVar18 = *pvVar18 + 1;
        }
        bVar4 = ::std::vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>::
                empty(&(this->m_requests).
                       super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                     );
        if (bVar4) {
          counters::inc_stats_counter(this->m_counters,0xed,1);
        }
        ::std::vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>::
        push_back(&(this->m_requests).
                   super_vector<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                  ,(value_type *)
                   t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        peVar11 = ::std::
                  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&ti);
        paVar16 = torrent::alerts(peVar11);
        bVar4 = alert_manager::should_post<libtorrent::incoming_request_alert>(paVar16);
        if (bVar4) {
          peVar11 = ::std::
                    __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&ti);
          paVar16 = torrent::alerts(peVar11);
          _Var3 = t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
          ::std::
          __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&ti);
          torrent::get_handle((torrent *)local_1f0);
          alert_manager::
          emplace_alert<libtorrent::incoming_request_alert,libtorrent::peer_request_const&,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::digest32<160l>&>
                    (paVar16,(peer_request *)_Var3._M_pi,(torrent_handle *)local_1f0,&this->m_remote
                     ,&this->m_peer_id);
          torrent_handle::~torrent_handle((torrent_handle *)local_1f0);
        }
        reference.__d.__r = (duration)(this->m_connect).__d.__r;
        new_value = time_now();
        relative_time::set(&this->m_last_incoming_request,reference,new_value);
        fill_send_buffer(this);
      }
      else {
        peer_log(this,info,"REJECTING REQUEST","peer choked and piece not in allowed fast set");
        counters::inc_stats_counter(this->m_counters,0x12,1);
        (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2b])
                  (this,t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
        local_198._M_t.
        super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
        ._M_t.
        super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
        .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl =
             (__uniq_ptr_data<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>,_true,_true>
              )time_now();
        local_1a4 = 2;
        ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1l>> *)&local_1a0,&local_1a4);
        local_190 = ::std::chrono::operator-
                              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&local_198,&local_1a0);
        local_1b8.__r = (this->m_connect).__d.__r;
        local_1b0.__d.__r =
             (duration)relative_time::get(&this->m_last_choke,(time_point)local_1b8.__r);
        bVar4 = ::std::chrono::operator>(&local_190,&local_1b0);
        local_452 = false;
        if (bVar4) {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)(local_1f0 + 0x28),too_many_requests_when_choked,(type *)0x0);
          local_452 = can_disconnect(this,(error_code *)(local_1f0 + 0x28));
        }
        if (local_452 != false) {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)(local_1f0 + 0x18),too_many_requests_when_choked,(type *)0x0);
          local_1f0[0x17] = 2;
          (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])
                    (this,(error_code *)(local_1f0 + 0x18),1,2);
          __range2._0_4_ = 1;
          goto LAB_00447751;
        }
      }
      __range2._0_4_ = 0;
    }
    else {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_180,too_many_requests_when_choked,(type *)0x0);
      local_181 = 2;
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,&local_180,1,2);
      __range2._0_4_ = 1;
    }
  }
LAB_00447751:
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)&ti);
  return;
}

Assistant:

void peer_connection::incoming_request(peer_request const& r)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		auto t = m_torrent.lock();
		TORRENT_ASSERT(t);
		torrent_info const& ti = t->torrent_file();

		m_counters.inc_stats_counter(counters::piece_requests);

#ifndef TORRENT_DISABLE_LOGGING
		const bool valid_piece_index
			= r.piece >= piece_index_t(0)
			&& r.piece < t->torrent_file().end_piece();

		peer_log(peer_log_alert::incoming_message, "REQUEST"
			, "piece: %d s: %x l: %x", static_cast<int>(r.piece), r.start, r.length);
#endif

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding()
			&& !super_seeded_piece(r.piece))
		{
			m_counters.inc_stats_counter(counters::invalid_piece_requests);
			if (m_num_invalid_requests < std::numeric_limits<decltype(m_num_invalid_requests)>::max())
				++m_num_invalid_requests;
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "INVALID_REQUEST", "piece not super-seeded "
					"i: %d t: %d n: %d h: %d ss1: %d ss2: %d"
					, m_peer_interested
					, valid_piece_index
						? t->torrent_file().piece_size(r.piece) : -1
					, t->torrent_file().num_pieces()
					, valid_piece_index ? t->has_piece_passed(r.piece) : 0
					, static_cast<int>(m_superseed_piece[0])
					, static_cast<int>(m_superseed_piece[1]));
			}
#endif

			write_reject_request(r);

			if (t->alerts().should_post<invalid_request_alert>())
			{
				// msvc 12 appears to deduce the rvalue reference template
				// incorrectly for bool temporaries. So, create a dummy instance
				bool const peer_interested = bool(m_peer_interested);
				t->alerts().emplace_alert<invalid_request_alert>(
					t->get_handle(), m_remote, m_peer_id, r
					, t->has_piece_passed(r.piece), peer_interested, true);
			}
			return;
		}
#endif // TORRENT_DISABLE_SUPERSEEDING

		// if we haven't received a bitfield, it was
		// probably omitted, which is the same as 'have_none'
		if (!m_bitfield_received) incoming_have_none();
		if (is_disconnecting()) return;

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			if (e->on_request(r)) return;
		}
		if (is_disconnecting()) return;
#endif

		if (!t->valid_metadata())
		{
			m_counters.inc_stats_counter(counters::invalid_piece_requests);
			// if we don't have valid metadata yet,
			// we shouldn't get a request
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "INVALID_REQUEST", "we don't have metadata yet");
#endif
			write_reject_request(r);
			return;
		}

		if (int(m_requests.size()) > m_settings.get_int(settings_pack::max_allowed_in_request_queue))
		{
			m_counters.inc_stats_counter(counters::max_piece_requests);
			// don't allow clients to abuse our
			// memory consumption.
			// ignore requests if the client
			// is making too many of them.
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "INVALID_REQUEST", "incoming request queue full %d"
				, int(m_requests.size()));
#endif
			write_reject_request(r);
			return;
		}

		int fast_idx = -1;
		auto const fast_iter = std::find(m_accept_fast.begin()
			, m_accept_fast.end(), r.piece);
		if (fast_iter != m_accept_fast.end()) fast_idx = int(fast_iter - m_accept_fast.begin());

		if (!m_peer_interested)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "INVALID_REQUEST", "peer is not interested "
					" t: %d n: %d block_limit: %d"
					, valid_piece_index
						? t->torrent_file().piece_size(r.piece) : -1
					, t->torrent_file().num_pieces()
					, t->block_size());
				peer_log(peer_log_alert::info, "INTERESTED", "artificial incoming INTERESTED message");
			}
#endif
			if (t->alerts().should_post<invalid_request_alert>())
			{
				t->alerts().emplace_alert<invalid_request_alert>(
					t->get_handle(), m_remote, m_peer_id, r
					, t->has_piece_passed(r.piece)
					, false, false);
			}

			// be lenient and pretend that the peer said it was interested
			incoming_interested();
		}

		// make sure this request
		// is legal and that the peer
		// is not choked
		if (r.piece < piece_index_t(0)
			|| r.piece >= t->torrent_file().end_piece()
			|| (!t->has_piece_passed(r.piece)
#ifndef TORRENT_DISABLE_PREDICTIVE_PIECES
				&& !t->is_predictive_piece(r.piece)
#endif
				&& !t->seed_mode())
			|| r.start < 0
			|| r.start >= ti.piece_size(r.piece)
			|| r.length <= 0
			|| r.length + r.start > ti.piece_size(r.piece)
			|| r.length > t->block_size())
		{
			m_counters.inc_stats_counter(counters::invalid_piece_requests);

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "INVALID_REQUEST"
					, "i: %d t: %d n: %d h: %d block_limit: %d"
					, m_peer_interested
					, valid_piece_index
						? t->torrent_file().piece_size(r.piece) : -1
					, ti.num_pieces()
					, t->has_piece_passed(r.piece)
					, t->block_size());
			}
#endif

			write_reject_request(r);
			if (m_num_invalid_requests < std::numeric_limits<decltype(m_num_invalid_requests)>::max())
				++m_num_invalid_requests;

			if (t->alerts().should_post<invalid_request_alert>())
			{
				// msvc 12 appears to deduce the rvalue reference template
				// incorrectly for bool temporaries. So, create a dummy instance
				bool const peer_interested = bool(m_peer_interested);
				t->alerts().emplace_alert<invalid_request_alert>(
					t->get_handle(), m_remote, m_peer_id, r
					, t->has_piece_passed(r.piece), peer_interested, false);
			}

			// every ten invalid request, remind the peer that it's choked
			if (!m_peer_interested && m_num_invalid_requests % 10 == 0 && m_choked)
			{
				// TODO: 2 this should probably be based on time instead of number
				// of request messages. For a very high throughput connection, 300
				// may be a legitimate number of requests to have in flight when
				// getting choked
				if (m_num_invalid_requests > 300 && !m_peer_choked
					&& can_disconnect(errors::too_many_requests_when_choked))
				{
					disconnect(errors::too_many_requests_when_choked, operation_t::bittorrent, peer_error);
					return;
				}
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::outgoing_message, "CHOKE");
#endif
				write_choke();
			}

			return;
		}

		// if we have choked the client
		// ignore the request
		int const blocks_per_piece =
			(ti.piece_length() + t->block_size() - 1) / t->block_size();

		// disconnect peers that downloads more than foo times an allowed
		// fast piece
		if (m_choked && fast_idx != -1 && m_accept_fast_piece_cnt[fast_idx] >= 3 * blocks_per_piece
			&& can_disconnect(errors::too_many_requests_when_choked))
		{
			disconnect(errors::too_many_requests_when_choked, operation_t::bittorrent, peer_error);
			return;
		}

		if (m_choked && fast_idx == -1)
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "REJECTING REQUEST", "peer choked and piece not in allowed fast set");
#endif
			m_counters.inc_stats_counter(counters::choked_piece_requests);
			write_reject_request(r);

			// allow peers to send request up to 2 seconds after getting choked,
			// then disconnect them
			if (aux::time_now() - seconds(2) > m_last_choke.get(m_connect)
				&& can_disconnect(errors::too_many_requests_when_choked))
			{
				disconnect(errors::too_many_requests_when_choked, operation_t::bittorrent, peer_error);
				return;
			}
		}
		else
		{
			// increase the allowed fast set counter
			if (fast_idx != -1)
				++m_accept_fast_piece_cnt[fast_idx];

			if (m_requests.empty())
				m_counters.inc_stats_counter(counters::num_peers_up_requests);

			TORRENT_ASSERT(t->valid_metadata());
			TORRENT_ASSERT(r.piece >= piece_index_t(0));
			TORRENT_ASSERT(r.piece < t->torrent_file().end_piece());
			TORRENT_ASSERT(r.length <= default_block_size);
			TORRENT_ASSERT(r.length > 0);

			m_requests.push_back(r);

			if (t->alerts().should_post<incoming_request_alert>())
			{
				t->alerts().emplace_alert<incoming_request_alert>(r, t->get_handle()
					, m_remote, m_peer_id);
			}

			m_last_incoming_request.set(m_connect, aux::time_now());
			fill_send_buffer();
		}
	}